

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O2

void __thiscall helics::EndpointInfo::setProperty(EndpointInfo *this,int32_t option,int32_t value)

{
  bool bVar1;
  
  bVar1 = value != 0;
  if (option == 0x20a) {
    this->requiredConnections = value;
  }
  else {
    if (option == 0x192) {
      this->required = value == 0;
      return;
    }
    if ((option == 0x197) || (option == 0x199)) {
      this->requiredConnections = (uint)(value != 0);
      return;
    }
    if (option == 0x1a6) {
      this->receiveOnly = bVar1;
      return;
    }
    if (option == 0x1a7) {
      this->sourceOnly = bVar1;
      return;
    }
    if (option == 0x18d) {
      this->required = bVar1;
      return;
    }
  }
  return;
}

Assistant:

void EndpointInfo::setProperty(int32_t option, int32_t value)
{
    const bool bvalue = (value != 0);
    switch (option) {
        case defs::Options::CONNECTION_REQUIRED:
            required = bvalue;
            break;
        case defs::Options::CONNECTION_OPTIONAL:
            required = !bvalue;
            break;
        case defs::Options::SEND_ONLY:
            sourceOnly = bvalue;
            break;
        case defs::Options::RECEIVE_ONLY:
            receiveOnly = bvalue;
            break;
        case defs::Options::SINGLE_CONNECTION_ONLY:
            requiredConnections = bvalue ? 1 : 0;
            break;
        case defs::Options::MULTIPLE_CONNECTIONS_ALLOWED:
            requiredConnections = !bvalue ? 0 : 1;
            break;
        case defs::Options::CONNECTIONS:
            requiredConnections = value;
            break;
        default:
            break;
    }
}